

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O3

float * ldr_to_hdr(stbi_uc *data,int x,int y,int comp)

{
  uint uVar1;
  float *pfVar2;
  long lVar3;
  uint uVar4;
  stbi_uc *psVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  float *pfVar10;
  double dVar11;
  
  uVar7 = x * y;
  pfVar2 = (float *)malloc((long)(int)(uVar7 * comp) << 2);
  if (pfVar2 == (float *)0x0) {
    free(data);
    failure_reason = "Out of memory";
  }
  else {
    if (0 < (int)uVar7) {
      uVar4 = (comp + (comp & 1U)) - 1;
      lVar6 = (long)comp;
      uVar8 = 0;
      psVar5 = data;
      pfVar10 = pfVar2;
      do {
        uVar1 = 0;
        if (0 < (int)uVar4) {
          uVar9 = 0;
          do {
            dVar11 = pow((double)((float)psVar5[uVar9] / 255.0),(double)l2h_gamma);
            pfVar10[uVar9] = (float)dVar11 * l2h_scale;
            uVar9 = uVar9 + 1;
            uVar1 = uVar4;
          } while (uVar4 != uVar9);
        }
        if ((int)uVar1 < comp) {
          lVar3 = (ulong)uVar1 + uVar8 * lVar6;
          pfVar2[lVar3] = (float)data[lVar3] / 255.0;
        }
        uVar8 = uVar8 + 1;
        psVar5 = psVar5 + lVar6;
        pfVar10 = pfVar10 + lVar6;
      } while (uVar8 != uVar7);
    }
    free(data);
  }
  return pfVar2;
}

Assistant:

static float   *ldr_to_hdr(stbi_uc *data, int x, int y, int comp)
{
   int i,k,n;
   float *output = (float *) malloc(x * y * comp * sizeof(float));
   if (output == NULL) { free(data); return epf("outofmem", "Out of memory"); }
   // compute number of non-alpha components
   if (comp & 1) n = comp; else n = comp-1;
   for (i=0; i < x*y; ++i) {
      for (k=0; k < n; ++k) {
         output[i*comp + k] = (float) pow(data[i*comp+k]/255.0f, l2h_gamma) * l2h_scale;
      }
      if (k < comp) output[i*comp + k] = data[i*comp+k]/255.0f;
   }
   free(data);
   return output;
}